

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseScriptModule
          (WastParser *this,
          unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> *out_module)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  ScriptModule *pSVar3;
  bool bVar4;
  Result RVar5;
  TokenType TVar6;
  TokenType TVar7;
  Result RVar8;
  ScriptModule *pSVar9;
  undefined **ppuVar10;
  TokenTypePair pair;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string name;
  Location loc;
  Token local_c8;
  string local_88;
  anon_union_16_2_ecfd7102_for_Location_1 *local_68;
  char *pcStack_60;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  RVar5 = Expect(this,Lpar);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_c8,this);
  local_58.offset = (size_t)local_c8.loc.field_1.field_1.offset;
  uStack_50 = local_c8.loc.field_1._8_8_;
  local_68 = (anon_union_16_2_ecfd7102_for_Location_1 *)local_c8.loc.filename._M_len;
  pcStack_60 = local_c8.loc.filename._M_str;
  RVar5 = Expect(this,Module);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&local_88);
  TVar6 = Peek(this,0);
  if (TVar6 == Quote) {
    Consume(&local_c8,this);
    local_c8.loc.filename._M_len = 0;
    local_c8.loc.filename._M_str = (char *)0x0;
    local_c8.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    bVar4 = ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8
                            );
    if (bVar4) {
      pSVar9 = (ScriptModule *)operator_new(0x68);
      pSVar9->_vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9->type_ = 0;
      pSVar9[2]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9[2].type_ = 0;
      pSVar9[1]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9[1].type_ = 0;
      pSVar9[3]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9[3].type_ = 0;
      pSVar9[4]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9[4].type_ = 0;
      pSVar9->type_ = Quoted;
      ppuVar10 = &PTR__DataScriptModule_0019b6b0;
LAB_0013f616:
      pSVar9->_vptr_ScriptModule = (_func_int **)ppuVar10;
      *(undefined8 *)&pSVar9[1].field_0xc = 0;
      *(undefined8 *)((long)&pSVar9[2]._vptr_ScriptModule + 4) = 0;
      pSVar9[3]._vptr_ScriptModule = (_func_int **)(pSVar9 + 4);
      pSVar9[5]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar9[5].type_ = 0;
      pSVar9[6]._vptr_ScriptModule = (_func_int **)0x0;
      std::__cxx11::string::_M_assign((string *)(pSVar9 + 3));
      pSVar9[2]._vptr_ScriptModule = (_func_int **)local_58.offset;
      *(undefined8 *)&pSVar9[2].type_ = uStack_50;
      pSVar9[1]._vptr_ScriptModule = (_func_int **)local_68;
      *(char **)&pSVar9[1].type_ = pcStack_60;
      pp_Var1 = pSVar9[5]._vptr_ScriptModule;
      pp_Var2 = pSVar9[6]._vptr_ScriptModule;
      pSVar9[5]._vptr_ScriptModule = (_func_int **)local_c8.loc.filename._M_len;
      *(char **)&pSVar9[5].type_ = local_c8.loc.filename._M_str;
      pSVar9[6]._vptr_ScriptModule = (_func_int **)local_c8.loc.field_1.field_1.offset;
      local_c8.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      local_c8.loc.filename._M_len = 0;
      local_c8.loc.filename._M_str = (char *)0x0;
      if (pp_Var1 != (_func_int **)0x0) {
        operator_delete(pp_Var1,(long)pp_Var2 - (long)pp_Var1);
      }
      pSVar3 = (out_module->_M_t).
               super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
               .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
      (out_module->_M_t).
      super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
      super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = pSVar9;
      if (pSVar3 != (ScriptModule *)0x0) {
        (*pSVar3->_vptr_ScriptModule[1])();
      }
    }
LAB_0013f690:
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_c8.loc.filename._M_len !=
        (anon_union_16_2_ecfd7102_for_Location_1 *)0x0) {
      operator_delete((void *)local_c8.loc.filename._M_len,
                      (long)local_c8.loc.field_1.field_1.offset - local_c8.loc.filename._M_len);
    }
    RVar5.enum_ = Error;
    if (bVar4 == false) goto LAB_0013fa00;
  }
  else {
    if (TVar6 == Bin) {
      Consume(&local_c8,this);
      local_c8.loc.filename._M_len = 0;
      local_c8.loc.filename._M_str = (char *)0x0;
      local_c8.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      bVar4 = ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &local_c8);
      if (bVar4) {
        pSVar9 = (ScriptModule *)operator_new(0x68);
        pSVar9->_vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9->type_ = 0;
        pSVar9[2]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9[2].type_ = 0;
        pSVar9[1]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9[1].type_ = 0;
        pSVar9[3]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9[3].type_ = 0;
        pSVar9[4]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar9[4].type_ = 0;
        pSVar9->type_ = Binary;
        ppuVar10 = &PTR__DataScriptModule_0019b648;
        goto LAB_0013f616;
      }
      goto LAB_0013f690;
    }
    pSVar9 = (ScriptModule *)operator_new(0x380);
    memset(pSVar9,0,0x370);
    pSVar9->_vptr_ScriptModule = (_func_int **)&PTR__TextScriptModule_0019b708;
    pSVar9[1]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[1].type_ = 0;
    *(undefined8 *)&pSVar9[1].field_0xc = 0;
    *(undefined8 *)((long)&pSVar9[2]._vptr_ScriptModule + 4) = 0;
    pSVar9[3]._vptr_ScriptModule = (_func_int **)(pSVar9 + 4);
    pSVar9[5]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[5].type_ = 0;
    pSVar9[6]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[6].type_ = 0;
    *(undefined8 *)&pSVar9[6].field_0xc = 0;
    *(undefined8 *)((long)&pSVar9[7]._vptr_ScriptModule + 4) = 0;
    memset(pSVar9 + 8,0,0x108);
    *(ScriptModuleType **)&pSVar9[0x18].type_ = &pSVar9[0x1b].type_;
    pSVar9[0x19]._vptr_ScriptModule = (_func_int **)0x1;
    *(undefined8 *)&pSVar9[0x19].type_ = 0;
    pSVar9[0x1a]._vptr_ScriptModule = (_func_int **)0x0;
    pSVar9[0x1a].type_ = 0x3f800000;
    pSVar9[0x1b]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[0x1b].type_ = 0;
    pSVar9[0x1c]._vptr_ScriptModule = (_func_int **)(pSVar9 + 0x1f);
    *(undefined8 *)&pSVar9[0x1c].type_ = 1;
    pSVar9[0x1d]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[0x1d].type_ = 0;
    *(undefined4 *)&pSVar9[0x1e]._vptr_ScriptModule = 0x3f800000;
    *(undefined8 *)&pSVar9[0x1e].type_ = 0;
    pSVar9[0x1f]._vptr_ScriptModule = (_func_int **)0x0;
    *(ScriptModuleType **)&pSVar9[0x1f].type_ = &pSVar9[0x22].type_;
    pSVar9[0x20]._vptr_ScriptModule = (_func_int **)0x1;
    *(undefined8 *)&pSVar9[0x20].type_ = 0;
    pSVar9[0x21]._vptr_ScriptModule = (_func_int **)0x0;
    pSVar9[0x21].type_ = 0x3f800000;
    pSVar9[0x22]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[0x22].type_ = 0;
    pSVar9[0x23]._vptr_ScriptModule = (_func_int **)(pSVar9 + 0x26);
    *(undefined8 *)&pSVar9[0x23].type_ = 1;
    pSVar9[0x24]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[0x24].type_ = 0;
    *(undefined4 *)&pSVar9[0x25]._vptr_ScriptModule = 0x3f800000;
    *(undefined8 *)&pSVar9[0x25].type_ = 0;
    pSVar9[0x26]._vptr_ScriptModule = (_func_int **)0x0;
    *(ScriptModuleType **)&pSVar9[0x26].type_ = &pSVar9[0x29].type_;
    pSVar9[0x27]._vptr_ScriptModule = (_func_int **)0x1;
    *(undefined8 *)&pSVar9[0x27].type_ = 0;
    pSVar9[0x28]._vptr_ScriptModule = (_func_int **)0x0;
    pSVar9[0x28].type_ = 0x3f800000;
    pSVar9[0x29]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[0x29].type_ = 0;
    pSVar9[0x2a]._vptr_ScriptModule = (_func_int **)(pSVar9 + 0x2d);
    *(undefined8 *)&pSVar9[0x2a].type_ = 1;
    pSVar9[0x2b]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[0x2b].type_ = 0;
    *(undefined4 *)&pSVar9[0x2c]._vptr_ScriptModule = 0x3f800000;
    *(undefined8 *)&pSVar9[0x2c].type_ = 0;
    pSVar9[0x2d]._vptr_ScriptModule = (_func_int **)0x0;
    *(ScriptModuleType **)&pSVar9[0x2d].type_ = &pSVar9[0x30].type_;
    pSVar9[0x2e]._vptr_ScriptModule = (_func_int **)0x1;
    *(undefined8 *)&pSVar9[0x2e].type_ = 0;
    pSVar9[0x2f]._vptr_ScriptModule = (_func_int **)0x0;
    pSVar9[0x2f].type_ = 0x3f800000;
    pSVar9[0x30]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[0x30].type_ = 0;
    pSVar9[0x31]._vptr_ScriptModule = (_func_int **)(pSVar9 + 0x34);
    *(undefined8 *)&pSVar9[0x31].type_ = 1;
    pSVar9[0x32]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[0x32].type_ = 0;
    *(undefined4 *)&pSVar9[0x33]._vptr_ScriptModule = 0x3f800000;
    *(undefined8 *)&pSVar9[0x33].type_ = 0;
    pSVar9[0x34]._vptr_ScriptModule = (_func_int **)0x0;
    *(ScriptModuleType **)&pSVar9[0x34].type_ = &pSVar9[0x37].type_;
    pSVar9[0x35]._vptr_ScriptModule = (_func_int **)0x1;
    *(undefined8 *)&pSVar9[0x35].type_ = 0;
    pSVar9[0x36]._vptr_ScriptModule = (_func_int **)0x0;
    pSVar9[0x36].type_ = 0x3f800000;
    pSVar9[0x37]._vptr_ScriptModule = (_func_int **)0x0;
    *(undefined8 *)&pSVar9[0x37].type_ = 0;
    std::__cxx11::string::_M_assign((string *)(pSVar9 + 3));
    pSVar9[2]._vptr_ScriptModule = (_func_int **)local_58.offset;
    *(undefined8 *)&pSVar9[2].type_ = uStack_50;
    pSVar9[1]._vptr_ScriptModule = (_func_int **)local_68;
    *(char **)&pSVar9[1].type_ = pcStack_60;
    TVar6 = Peek(this,0);
    TVar7 = Peek(this,1);
    pair._M_elems[1] = TVar7;
    pair._M_elems[0] = TVar6;
    bVar4 = anon_unknown_1::IsModuleField(pair);
    if (!bVar4) {
      TVar6 = Peek(this,0);
      if (TVar6 == Rpar) goto LAB_0013f938;
      Match(this,Lpar);
      local_c8.loc.filename._M_len = (size_t)&local_c8.loc.field_1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"a module field","");
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 &local_c8,&local_c8.token_type_);
      RVar5 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_c8.loc.filename._M_len !=
          &local_c8.loc.field_1) {
        operator_delete((void *)local_c8.loc.filename._M_len,
                        (long)local_c8.loc.field_1.field_1.offset + 1);
      }
LAB_0013f9f7:
      (*pSVar9->_vptr_ScriptModule[1])(pSVar9);
      goto LAB_0013fa00;
    }
    RVar8 = ParseModuleFieldList(this,(Module *)(pSVar9 + 1));
    RVar5.enum_ = Error;
    if (RVar8.enum_ == Error) goto LAB_0013f9f7;
LAB_0013f938:
    pSVar3 = (out_module->_M_t).
             super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
             _M_t.
             super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
             super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
    (out_module->_M_t).
    super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
    super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = pSVar9;
    if (pSVar3 != (ScriptModule *)0x0) {
      (*pSVar3->_vptr_ScriptModule[1])();
    }
  }
  RVar5 = Expect(this,Rpar);
  RVar5.enum_ = (Enum)(RVar5.enum_ == Error);
LAB_0013fa00:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return (Result)RVar5.enum_;
}

Assistant:

Result WastParser::ParseScriptModule(
    std::unique_ptr<ScriptModule>* out_module) {
  WABT_TRACE(ParseScriptModule);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Module);
  std::string name;
  ParseBindVarOpt(&name);

  switch (Peek()) {
    case TokenType::Bin: {
      Consume();
      std::vector<uint8_t> data;
      // TODO(binji): The spec allows this to be empty, switch to
      // ParseTextListOpt.
      CHECK_RESULT(ParseTextList(&data));

      auto bsm = std::make_unique<BinaryScriptModule>();
      bsm->name = name;
      bsm->loc = loc;
      bsm->data = std::move(data);
      *out_module = std::move(bsm);
      break;
    }

    case TokenType::Quote: {
      Consume();
      std::vector<uint8_t> data;
      // TODO(binji): The spec allows this to be empty, switch to
      // ParseTextListOpt.
      CHECK_RESULT(ParseTextList(&data));

      auto qsm = std::make_unique<QuotedScriptModule>();
      qsm->name = name;
      qsm->loc = loc;
      qsm->data = std::move(data);
      *out_module = std::move(qsm);
      break;
    }

    default: {
      auto tsm = std::make_unique<TextScriptModule>();
      tsm->module.name = name;
      tsm->module.loc = loc;
      if (IsModuleField(PeekPair())) {
        CHECK_RESULT(ParseModuleFieldList(&tsm->module));
      } else if (!PeekMatch(TokenType::Rpar)) {
        ConsumeIfLpar();
        return ErrorExpected({"a module field"});
      }
      *out_module = std::move(tsm);
      break;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}